

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

void generate_info_set(MppBufSlotsImpl *impl,MppFrame frame,RK_U32 force_def_align)

{
  MppFrame pvVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  MppFrameFormat v;
  RK_U32 *local_78;
  uint local_6c;
  RK_U32 down_scale_y_virstride;
  RK_U32 downscale_buf_size;
  RK_U32 down_scale_hor;
  RK_U32 down_scale_ver;
  MppFrameImpl *frame_impl;
  MppFrameImpl *info_set_impl;
  MppBufSlotInfoSet *info_set_ptr;
  MppBufSlotInfoSet sys_cfg_info_set;
  MppBufSlotInfoSet legacy_info_set;
  MppFrameFormat fmt;
  RK_U32 height;
  RK_U32 width;
  RK_U32 force_def_align_local;
  MppFrame frame_local;
  MppBufSlotsImpl *impl_local;
  
  RVar2 = mpp_frame_get_width(frame);
  RVar3 = mpp_frame_get_height(frame);
  v = mpp_frame_get_fmt(frame);
  prepare_info_set_legacy
            (impl,frame,(MppBufSlotInfoSet *)&sys_cfg_info_set.v_stride,force_def_align);
  prepare_info_set_by_sys_cfg(impl,frame,(MppBufSlotInfoSet *)&info_set_ptr);
  mpp_frame_set_width(impl->info_set,RVar2);
  mpp_frame_set_height(impl->info_set,RVar3);
  mpp_frame_set_fmt(impl->info_set,v);
  if (use_legacy_align == 0) {
    local_78 = (RK_U32 *)&info_set_ptr;
  }
  else {
    local_78 = &sys_cfg_info_set.v_stride;
  }
  mpp_frame_set_hor_stride(impl->info_set,local_78[1]);
  mpp_frame_set_ver_stride(impl->info_set,local_78[2]);
  mpp_frame_set_hor_stride_pixel(impl->info_set,*local_78);
  mpp_frame_set_buf_size(impl->info_set,(ulong)local_78[3]);
  mpp_frame_set_buf_size(frame,(ulong)local_78[3]);
  mpp_frame_set_hor_stride(frame,local_78[1]);
  mpp_frame_set_ver_stride(frame,local_78[2]);
  mpp_frame_set_hor_stride_pixel(frame,*local_78);
  impl->buf_size = (ulong)local_78[3];
  RVar2 = mpp_frame_get_thumbnail_en(frame);
  if (RVar2 == 1) {
    RVar2 = mpp_frame_get_height(frame);
    RVar3 = mpp_frame_get_width(frame);
    local_6c = ((RVar2 >> 1) + 0xf & 0xfffffff0) * ((RVar3 >> 1) + 0xf & 0xfffffff0);
    switch(v & 0xfffff) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV420SP_10BIT:
      local_6c = local_6c * 3 >> 1;
      break;
    case MPP_FMT_YUV422SP:
    case MPP_FMT_YUV422SP_10BIT:
      local_6c = local_6c * 2;
      break;
    default:
      local_6c = local_6c * 3 >> 1;
      break;
    case MPP_FMT_YUV400:
      break;
    case MPP_FMT_YUV444SP:
    case MPP_FMT_YUV444SP_10BIT:
      local_6c = local_6c * 3;
    }
    impl->buf_size = (ulong)local_6c + impl->buf_size;
    mpp_frame_set_buf_size(impl->info_set,impl->buf_size);
    mpp_frame_set_buf_size(frame,impl->buf_size);
  }
  pvVar1 = impl->info_set;
  *(undefined4 *)((long)pvVar1 + 0x54) = *(undefined4 *)((long)frame + 0x54);
  *(undefined4 *)((long)pvVar1 + 0x58) = *(undefined4 *)((long)frame + 0x58);
  *(undefined4 *)((long)pvVar1 + 0x5c) = *(undefined4 *)((long)frame + 0x5c);
  *(undefined4 *)((long)pvVar1 + 0x60) = *(undefined4 *)((long)frame + 0x60);
  *(undefined4 *)((long)pvVar1 + 100) = *(undefined4 *)((long)frame + 100);
  if (impl->align_chk_log_en != 0) {
    impl->align_chk_log_en = 0;
    if (sys_cfg_info_set.v_stride != (uint)info_set_ptr) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch h_stride_by_pixel %d - %d\n",(char *)0x0,
                 (ulong)sys_cfg_info_set.v_stride,(ulong)(uint)info_set_ptr);
    }
    if (sys_cfg_info_set.size_total != info_set_ptr._4_4_) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch h_stride_by_byte %d - %d\n",(char *)0x0,
                 (ulong)sys_cfg_info_set.size_total,(ulong)info_set_ptr._4_4_);
    }
    if (legacy_info_set.h_stride_by_pixel != sys_cfg_info_set.h_stride_by_pixel) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch v_stride %d - %d\n",(char *)0x0,
                 (ulong)legacy_info_set.h_stride_by_pixel,(ulong)sys_cfg_info_set.h_stride_by_pixel)
      ;
    }
    if (legacy_info_set.h_stride_by_byte != sys_cfg_info_set.h_stride_by_byte) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch size_total %d - %d\n",(char *)0x0,
                 (ulong)legacy_info_set.h_stride_by_byte,(ulong)sys_cfg_info_set.h_stride_by_byte);
    }
  }
  return;
}

Assistant:

static void generate_info_set(MppBufSlotsImpl *impl, MppFrame frame, RK_U32 force_def_align)
{
    const RK_U32 width  = mpp_frame_get_width(frame);
    const RK_U32 height = mpp_frame_get_height(frame);
    const MppFrameFormat fmt = mpp_frame_get_fmt(frame);
    MppBufSlotInfoSet legacy_info_set;
    MppBufSlotInfoSet sys_cfg_info_set;
    MppBufSlotInfoSet *info_set_ptr = NULL;
    MppFrameImpl *info_set_impl = NULL;
    MppFrameImpl *frame_impl = NULL;

    prepare_info_set_legacy(impl, frame, &legacy_info_set, force_def_align);
    prepare_info_set_by_sys_cfg(impl, frame, &sys_cfg_info_set);

    mpp_frame_set_width(impl->info_set, width);
    mpp_frame_set_height(impl->info_set, height);
    mpp_frame_set_fmt(impl->info_set, fmt);
    info_set_ptr = use_legacy_align ? &legacy_info_set : &sys_cfg_info_set;
    mpp_frame_set_hor_stride(impl->info_set, info_set_ptr->h_stride_by_byte);
    mpp_frame_set_ver_stride(impl->info_set, info_set_ptr->v_stride);
    mpp_frame_set_hor_stride_pixel(impl->info_set, info_set_ptr->h_stride_by_pixel);
    mpp_frame_set_buf_size(impl->info_set, info_set_ptr->size_total);
    mpp_frame_set_buf_size(frame, info_set_ptr->size_total);
    mpp_frame_set_hor_stride(frame, info_set_ptr->h_stride_by_byte);
    mpp_frame_set_ver_stride(frame, info_set_ptr->v_stride);
    mpp_frame_set_hor_stride_pixel(frame, info_set_ptr->h_stride_by_pixel);
    impl->buf_size = info_set_ptr->size_total;

    if (mpp_frame_get_thumbnail_en(frame) == MPP_FRAME_THUMBNAIL_MIXED) {
        /*
         * The decode hw only support 1/2 scaling in width and height,
         * downscale output image only support raster mode with 8bit depth.
         */
        RK_U32 down_scale_ver = MPP_ALIGN(mpp_frame_get_height(frame) >> 1, 16);
        RK_U32 down_scale_hor = MPP_ALIGN(mpp_frame_get_width(frame) >> 1, 16);
        RK_U32 downscale_buf_size;
        RK_U32 down_scale_y_virstride = down_scale_ver * down_scale_hor;

        switch ((fmt & MPP_FRAME_FMT_MASK)) {
        case MPP_FMT_YUV400 : {
            downscale_buf_size = down_scale_y_virstride;
        } break;
        case MPP_FMT_YUV420SP_10BIT :
        case MPP_FMT_YUV420SP : {
            downscale_buf_size = down_scale_y_virstride * 3 / 2;
        } break;
        case MPP_FMT_YUV422SP_10BIT :
        case MPP_FMT_YUV422SP : {
            downscale_buf_size = down_scale_y_virstride * 2;
        } break;
        case MPP_FMT_YUV444SP_10BIT :
        case MPP_FMT_YUV444SP : {
            downscale_buf_size = down_scale_y_virstride * 3;
        } break;
        default : {
            downscale_buf_size = down_scale_y_virstride * 3 / 2;
        } break;
        }
        downscale_buf_size = MPP_ALIGN(downscale_buf_size, 16);
        impl->buf_size += downscale_buf_size;
        mpp_frame_set_buf_size(impl->info_set, impl->buf_size);
        mpp_frame_set_buf_size(frame, impl->buf_size);
    }
    info_set_impl = (MppFrameImpl *)impl->info_set;
    frame_impl    = (MppFrameImpl *)frame;
    info_set_impl->color_range      = frame_impl->color_range;
    info_set_impl->color_primaries  = frame_impl->color_primaries;
    info_set_impl->color_trc        = frame_impl->color_trc;
    info_set_impl->colorspace       = frame_impl->colorspace;
    info_set_impl->chroma_location  = frame_impl->chroma_location;

    if (impl->align_chk_log_en) {
        impl->align_chk_log_en = 0;
        if (legacy_info_set.h_stride_by_pixel != sys_cfg_info_set.h_stride_by_pixel)
            mpp_logi("mismatch h_stride_by_pixel %d - %d\n",
                     legacy_info_set.h_stride_by_pixel,
                     sys_cfg_info_set.h_stride_by_pixel);
        if (legacy_info_set.h_stride_by_byte != sys_cfg_info_set.h_stride_by_byte)
            mpp_logi("mismatch h_stride_by_byte %d - %d\n",
                     legacy_info_set.h_stride_by_byte,
                     sys_cfg_info_set.h_stride_by_byte);
        if (legacy_info_set.v_stride != sys_cfg_info_set.v_stride)
            mpp_logi("mismatch v_stride %d - %d\n",
                     legacy_info_set.v_stride,
                     sys_cfg_info_set.v_stride);
        if (legacy_info_set.size_total != sys_cfg_info_set.size_total)
            mpp_logi("mismatch size_total %d - %d\n",
                     legacy_info_set.size_total,
                     sys_cfg_info_set.size_total);
    }
}